

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spoa_test.cpp
# Opt level: O2

void __thiscall
spoa::test::SpoaAlignmentTest_TypeError_Test::TestBody(SpoaAlignmentTest_TypeError_Test *this)

{
  AssertionResult gtest_ar;
  
  AlignmentEngine::Create((AlignmentEngine *)&gtest_ar,4,'\x01',-1,-1);
  if (gtest_ar._0_8_ != 0) {
    (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
  }
  return;
}

Assistant:

TEST(SpoaAlignmentTest, TypeError) {
  try {
    auto ae = AlignmentEngine::Create(static_cast<AlignmentType>(4), 1, -1, -1);
  } catch(std::invalid_argument& exception) {
    EXPECT_STREQ(
        exception.what(),
        "[spoa::AlignmentEngine::Create] error: invalid alignment type!");
  }
}